

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O3

void Gia_ManCofOneDerive_rec(Ccf_Man_t *p,int Id)

{
  uint uVar1;
  ulong uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  if (-1 < Id) {
    pVVar4 = p->vCopies;
    iVar6 = pVVar4->nSize;
    if (Id < iVar6) {
      if (pVVar4->pArray[(uint)Id] == -1) {
        if (p->pFrames->nObjs <= Id) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar2 = *(ulong *)(p->pFrames->pObjs + (uint)Id);
        uVar5 = (uint)uVar2;
        uVar8 = (uint)(uVar2 >> 0x20);
        if ((~uVar5 & 0x9fffffff) == 0) {
          if ((int)(uVar8 & 0x1fffffff) < p->pGia->nRegs) {
            uVar5 = Id * 2;
          }
          else {
            if (p->pSat->size <= Id) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                            ,0xcd,"int sat_solver_var_value(sat_solver *, int)");
            }
            uVar5 = (uint)(p->pSat->model[(uint)Id] == 1);
          }
        }
        else {
          if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCCof.c"
                          ,0xa0,"void Gia_ManCofOneDerive_rec(Ccf_Man_t *, int)");
          }
          uVar7 = Id - (uVar8 & 0x1fffffff);
          Gia_ManCofOneDerive_rec(p,Id - (uVar5 & 0x1fffffff));
          Gia_ManCofOneDerive_rec(p,uVar7);
          uVar5 = Id - (uVar5 & 0x1fffffff);
          if ((int)uVar5 < 0) goto LAB_00660219;
          uVar1 = p->vCopies->nSize;
          if ((int)uVar1 <= (int)uVar5) goto LAB_00660219;
          piVar3 = p->vCopies->pArray;
          uVar5 = piVar3[uVar5];
          if ((int)uVar5 < 0) {
LAB_00660276:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10f,"int Abc_LitNotCond(int, int)");
          }
          if (((int)uVar7 < 0) || (uVar1 <= uVar7)) goto LAB_00660219;
          uVar7 = piVar3[uVar7];
          if ((int)uVar7 < 0) goto LAB_00660276;
          uVar5 = Gia_ManHashAnd(p->pFrames,uVar5 ^ (uint)(uVar2 >> 0x1d) & 1,
                                 uVar7 ^ uVar8 >> 0x1d & 1);
          pVVar4 = p->vCopies;
          iVar6 = pVVar4->nSize;
        }
        if (iVar6 <= Id) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar4->pArray[(uint)Id] = uVar5;
      }
      return;
    }
  }
LAB_00660219:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManCofOneDerive_rec( Ccf_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    int Res;
    if ( Vec_IntEntry(p->vCopies, Id) != -1 )
        return;
    pObj = Gia_ManObj(p->pFrames, Id);
    assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsAnd(pObj) )
    {
        int fCompl0 = Gia_ObjFaninC0(pObj);
        int fCompl1 = Gia_ObjFaninC1(pObj);
        int Fan0 = Gia_ObjFaninId0p(p->pFrames, pObj);
        int Fan1 = Gia_ObjFaninId1p(p->pFrames, pObj);
        Gia_ManCofOneDerive_rec( p, Fan0 );
        Gia_ManCofOneDerive_rec( p, Fan1 );
        Res = Gia_ManHashAnd( p->pFrames, 
            Gia_Obj0Copy(p->vCopies, Fan0, fCompl0), 
            Gia_Obj1Copy(p->vCopies, Fan1, fCompl1) );
    }
    else if ( Gia_ObjCioId(pObj) >= Gia_ManRegNum(p->pGia) ) // PI
        Res = sat_solver_var_value( p->pSat, Id );
    else
        Res = Abc_Var2Lit( Id, 0 );
    Vec_IntWriteEntry( p->vCopies, Id, Res );
}